

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::RegexMatcher::replaceAll
          (UnicodeString *__return_storage_ptr__,RegexMatcher *this,UnicodeString *replacement,
          UErrorCode *status)

{
  UText resultText;
  UText replacementText;
  UText local_150;
  UText local_c0;
  
  memset(&local_c0,0,0x90);
  local_c0.magic = 0x345ad82c;
  local_c0.sizeOfStruct = 0x90;
  memset(&local_150,0,0x90);
  local_150.magic = 0x345ad82c;
  local_150.sizeOfStruct = 0x90;
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00251160;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    utext_openConstUnicodeString_63(&local_c0,replacement,status);
    utext_openUnicodeString_63(&local_150,__return_storage_ptr__,status);
    replaceAll(this,&local_c0,&local_150,status);
    utext_close_63(&local_150);
    utext_close_63(&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString RegexMatcher::replaceAll(const UnicodeString &replacement, UErrorCode &status) {
    UText replacementText = UTEXT_INITIALIZER;
    UText resultText = UTEXT_INITIALIZER;
    UnicodeString resultString;
    if (U_FAILURE(status)) {
        return resultString;
    }

    utext_openConstUnicodeString(&replacementText, &replacement, &status);
    utext_openUnicodeString(&resultText, &resultString, &status);

    replaceAll(&replacementText, &resultText, status);

    utext_close(&resultText);
    utext_close(&replacementText);

    return resultString;
}